

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O1

int __thiscall Snes_Spc::init(Snes_Spc *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  byte bVar4;
  ushort uVar13;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  lVar3 = 0;
  memset(&this->m,0,0x10468);
  Spc_Dsp::init(&this->dsp,(EVP_PKEY_CTX *)(this->m).ram.ram);
  (this->m).tempo = 0x100;
  (this->m).rom[0x3e] = 0xff;
  auVar2 = _DAT_00776ba0;
  (this->m).rom[0x3f] = 0xc0;
  do {
    uVar1 = *(undefined8 *)(init::cycle_table + lVar3);
    auVar6._0_2_ = (ushort)uVar1 >> 4;
    uVar13 = (ushort)((ulong)uVar1 >> 0x34);
    auVar8._0_10_ = (unkuint10)uVar13 << 0x30;
    auVar10._0_12_ = ZEXT212(uVar13) << 0x30;
    auVar12._0_14_ = ZEXT214(uVar13) << 0x30;
    bVar4 = (byte)((ulong)uVar1 >> 0x38);
    auVar12[0xe] = bVar4 >> 4;
    auVar12[0xf] = bVar4;
    auVar11._14_2_ = auVar12._14_2_;
    auVar11._0_13_ = ZEXT213(uVar13) << 0x30;
    auVar11[0xd] = (char)((ulong)uVar1 >> 0x30);
    auVar10._13_3_ = auVar11._13_3_;
    auVar10[0xc] = (char)uVar13;
    bVar4 = (byte)((ulong)uVar1 >> 0x28);
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_11_ = ZEXT211(uVar13) << 0x30;
    auVar9[0xb] = bVar4;
    auVar8._11_5_ = auVar9._11_5_;
    auVar8[10] = bVar4 >> 4;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_9_ = (unkuint9)uVar13 << 0x30;
    auVar7[9] = (char)((ulong)uVar1 >> 0x20);
    bVar4 = (byte)((ulong)uVar1 >> 0x18);
    auVar6._8_8_ = (undefined8)
                   (CONCAT73(auVar7._9_7_,
                             CONCAT12((char)((ushort)((ulong)uVar1 >> 0x20) >> 4),uVar13)) >> 0x10);
    auVar6[7] = bVar4;
    auVar6[6] = bVar4 >> 4;
    auVar6[5] = (char)((ulong)uVar1 >> 0x10);
    auVar6[4] = (char)((ushort)((ulong)uVar1 >> 0x10) >> 4);
    bVar4 = (byte)((ulong)uVar1 >> 8);
    auVar6[3] = bVar4;
    auVar6[2] = bVar4 >> 4;
    auVar5._2_14_ = auVar6._2_14_;
    auVar5[0] = (undefined1)auVar6._0_2_;
    auVar5[1] = (char)uVar1;
    *(undefined1 (*) [16])((this->m).cycle_table + lVar3 * 2) = auVar5 & auVar2;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x80);
  memcpy(this->reg_times,reg_times_,0x100);
  reset(this);
  return 0;
}

Assistant:

blargg_err_t Snes_Spc::init()
{
	memset( &m, 0, sizeof m );
	dsp.init( RAM );
	
	m.tempo = tempo_unit;
	
	// Most SPC music doesn't need ROM, and almost all the rest only rely
	// on these two bytes
	m.rom [0x3E] = 0xFF;
	m.rom [0x3F] = 0xC0;
	
	static unsigned char const cycle_table [128] =
	{//   01   23   45   67   89   AB   CD   EF
	    0x28,0x47,0x34,0x36,0x26,0x54,0x54,0x68, // 0
	    0x48,0x47,0x45,0x56,0x55,0x65,0x22,0x46, // 1
	    0x28,0x47,0x34,0x36,0x26,0x54,0x54,0x74, // 2
	    0x48,0x47,0x45,0x56,0x55,0x65,0x22,0x38, // 3
	    0x28,0x47,0x34,0x36,0x26,0x44,0x54,0x66, // 4
	    0x48,0x47,0x45,0x56,0x55,0x45,0x22,0x43, // 5
	    0x28,0x47,0x34,0x36,0x26,0x44,0x54,0x75, // 6
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0x36, // 7
	    0x28,0x47,0x34,0x36,0x26,0x54,0x52,0x45, // 8
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0xC5, // 9
	    0x38,0x47,0x34,0x36,0x26,0x44,0x52,0x44, // A
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0x34, // B
	    0x38,0x47,0x45,0x47,0x25,0x64,0x52,0x49, // C
	    0x48,0x47,0x56,0x67,0x45,0x55,0x22,0x83, // D
	    0x28,0x47,0x34,0x36,0x24,0x53,0x43,0x40, // E
	    0x48,0x47,0x45,0x56,0x34,0x54,0x22,0x60, // F
	};
	
	// unpack cycle table
	for ( int i = 0; i < 128; i++ )
	{
		int n = cycle_table [i];
		m.cycle_table [i * 2 + 0] = n >> 4;
		m.cycle_table [i * 2 + 1] = n & 0x0F;
	}
	
	#if SPC_LESS_ACCURATE
		memcpy( reg_times, reg_times_, sizeof reg_times );
	#endif
	
	reset();
	return 0;
}